

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

void free_wb_list(socket_server *ss,wb_list *list)

{
  write_buffer *pwVar1;
  write_buffer *wb;
  
  wb = list->head;
  while (wb != (write_buffer *)0x0) {
    pwVar1 = wb->next;
    write_buffer_free(ss,wb);
    wb = pwVar1;
  }
  list->head = (write_buffer *)0x0;
  list->tail = (write_buffer *)0x0;
  return;
}

Assistant:

static void
free_wb_list(struct socket_server *ss, struct wb_list *list) {
	struct write_buffer *wb = list->head;
	while (wb) {
		struct write_buffer *tmp = wb;
		wb = wb->next;
		write_buffer_free(ss, tmp);
	}
	list->head = NULL;
	list->tail = NULL;
}